

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffccls(fitsfile *infptr,fitsfile *outfptr,int incol,int outcol,int ncols,int create_col,
          int *status)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  int *in_stack_00000008;
  int outcol1;
  int incol1;
  int icol;
  int ikey;
  char keyarr [1001] [81];
  char *tforms [1000];
  char *ttypes [1000];
  int typecodes [1000];
  float *fvalues;
  float fnull;
  double *dvalues;
  double dnull;
  char nulstr [2];
  char **strarray;
  char nullflag;
  char *lvalues;
  char tform_comm [73];
  char ttype_comm [73];
  char tform [71];
  char ttype [71];
  char keyname [75];
  long ii;
  long firstelem;
  long firstrow;
  long npixels;
  long ntodo;
  long ndone;
  long maxloop;
  long outloop;
  long inloop;
  long outrows;
  long nrows;
  long owidth;
  long width;
  long orepeat;
  long repeat;
  long tfields;
  int outHduType;
  int inHduType;
  int anynull;
  int otypecode;
  int typecode;
  int colnum;
  int tstatus;
  undefined4 in_stack_fffffffffffe7270;
  int iVar5;
  int iVar6;
  int *in_stack_fffffffffffe7288;
  undefined4 in_stack_fffffffffffe7290;
  int in_stack_fffffffffffe7294;
  fitsfile *in_stack_fffffffffffe7298;
  int in_stack_fffffffffffe72a4;
  int *in_stack_fffffffffffe72a8;
  char *in_stack_fffffffffffe72b0;
  long *in_stack_fffffffffffe72b8;
  char *in_stack_fffffffffffe72c0;
  fitsfile *in_stack_fffffffffffe72c8;
  int *in_stack_fffffffffffe72d0;
  int *in_stack_fffffffffffe72d8;
  int in_stack_fffffffffffe72e4;
  fitsfile *in_stack_fffffffffffe72e8;
  int *in_stack_fffffffffffe7360;
  char *in_stack_fffffffffffe7368;
  int *in_stack_fffffffffffe7370;
  fitsfile *in_stack_fffffffffffe7378;
  int *in_stack_fffffffffffe73b0;
  char *in_stack_fffffffffffe73b8;
  int in_stack_fffffffffffe73c0;
  int in_stack_fffffffffffe73c4;
  fitsfile *in_stack_fffffffffffe73c8;
  fitsfile *in_stack_fffffffffffe73d0;
  int *in_stack_fffffffffffe7438;
  char **in_stack_fffffffffffe7440;
  char **in_stack_fffffffffffe7448;
  int in_stack_fffffffffffe7450;
  int in_stack_fffffffffffe7454;
  fitsfile *in_stack_fffffffffffe7458;
  int *in_stack_fffffffffffe7538;
  int in_stack_fffffffffffe7544;
  int in_stack_fffffffffffe7548;
  int in_stack_fffffffffffe754c;
  fitsfile *in_stack_fffffffffffe7550;
  fitsfile *in_stack_fffffffffffe7558;
  long local_50b8 [1000];
  long local_3178 [1000];
  int aiStack_1238 [1000];
  undefined8 local_298;
  undefined4 local_28c;
  undefined8 local_288;
  undefined8 local_280;
  undefined2 local_272;
  undefined8 local_270;
  undefined8 local_260;
  char local_1b8 [80];
  char local_168 [264];
  long local_60;
  long local_58;
  int local_50;
  int local_44;
  int local_40;
  int local_34;
  int local_30;
  undefined4 local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int *local_18;
  int *local_10;
  int local_4;
  
  local_260 = 0;
  local_270 = 0;
  local_272 = 5;
  local_280 = 0;
  local_288 = 0;
  local_28c = 0;
  local_298 = 0;
  iVar6 = 0;
  if (*in_stack_00000008 < 1) {
    if (in_R8D < 0x3e9) {
      local_28 = in_R9D;
      local_24 = in_R8D;
      local_20 = in_ECX;
      local_1c = in_EDX;
      local_18 = in_RSI;
      local_10 = in_RDI;
      if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
        if (*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) {
          ffrdef(in_stack_fffffffffffe7378,in_stack_fffffffffffe7370);
        }
      }
      else {
        ffmahd(in_stack_fffffffffffe72e8,in_stack_fffffffffffe72e4,in_stack_fffffffffffe72d8,
               in_stack_fffffffffffe72d0);
      }
      local_40 = *(int *)(*(long *)(local_10 + 2) + 0x58);
      if (*local_18 == *(int *)(*(long *)(local_18 + 2) + 0x54)) {
        if (*(long *)(*(long *)(local_18 + 2) + 0x88) == -1) {
          ffrdef(in_stack_fffffffffffe7378,in_stack_fffffffffffe7370);
        }
      }
      else {
        ffmahd(in_stack_fffffffffffe72e8,in_stack_fffffffffffe72e4,in_stack_fffffffffffe72d8,
               in_stack_fffffffffffe72d0);
      }
      local_44 = *(int *)(*(long *)(local_18 + 2) + 0x58);
      if (*in_stack_00000008 < 1) {
        if ((local_40 == 0) || (local_44 == 0)) {
          ffpmsg((char *)0x1240e9);
          *in_stack_00000008 = 0xeb;
          local_4 = 0xeb;
        }
        else if (((local_40 == 2) && (local_44 == 1)) || ((local_40 == 1 && (local_44 == 2)))) {
          ffpmsg((char *)0x12413b);
          *in_stack_00000008 = 0xe3;
          local_4 = 0xe3;
        }
        else if ((*(long *)(local_10 + 2) == *(long *)(local_18 + 2)) && (*local_10 == *local_18)) {
          ffpmsg((char *)0x124195);
          *in_stack_00000008 = 0xe3;
          local_4 = 0xe3;
        }
        else {
          local_2c = 0;
          iVar1 = ffgkyj(in_stack_fffffffffffe72c8,in_stack_fffffffffffe72c0,
                         in_stack_fffffffffffe72b8,in_stack_fffffffffffe72b0,
                         in_stack_fffffffffffe72a8);
          if (iVar1 == 0) {
            iVar1 = local_20;
            if (local_50 + 1 < local_20) {
              iVar1 = local_50 + 1;
            }
            iVar4 = iVar1;
            iVar3 = local_1c;
            local_30 = iVar1;
            for (iVar5 = 0; iVar5 < local_24; iVar5 = iVar5 + 1) {
              ffgtcl(in_stack_fffffffffffe7298,in_stack_fffffffffffe7294,in_stack_fffffffffffe7288,
                     (long *)CONCAT44(iVar6,iVar5),(long *)CONCAT44(iVar3,iVar4),
                     (int *)CONCAT44(iVar1,in_stack_fffffffffffe7270));
              if (local_34 < 0) {
                ffpmsg((char *)0x1242c6);
                *in_stack_00000008 = 0x105;
                return 0x105;
              }
              aiStack_1238[iVar5] = local_34;
              local_2c = 0;
              ffkeyn((char *)in_stack_fffffffffffe72a8,in_stack_fffffffffffe72a4,
                     (char *)in_stack_fffffffffffe7298,
                     (int *)CONCAT44(in_stack_fffffffffffe7294,in_stack_fffffffffffe7290));
              ffgkys(in_stack_fffffffffffe72c8,in_stack_fffffffffffe72c0,
                     (char *)in_stack_fffffffffffe72b8,in_stack_fffffffffffe72b0,
                     in_stack_fffffffffffe72a8);
              ffkeyn((char *)in_stack_fffffffffffe72a8,in_stack_fffffffffffe72a4,
                     (char *)in_stack_fffffffffffe7298,
                     (int *)CONCAT44(in_stack_fffffffffffe7294,in_stack_fffffffffffe7290));
              iVar2 = ffgkys(in_stack_fffffffffffe72c8,in_stack_fffffffffffe72c0,
                             (char *)in_stack_fffffffffffe72b8,in_stack_fffffffffffe72b0,
                             in_stack_fffffffffffe72a8);
              if (iVar2 != 0) {
                ffpmsg((char *)0x1243ad);
                *in_stack_00000008 = 0xe8;
                return 0xe8;
              }
              if (local_28 == 0) {
                ffgtcl(in_stack_fffffffffffe7298,in_stack_fffffffffffe7294,in_stack_fffffffffffe7288
                       ,(long *)CONCAT44(iVar6,iVar5),(long *)CONCAT44(iVar3,iVar4),
                       (int *)CONCAT44(iVar1,in_stack_fffffffffffe7270));
                if (local_60 != local_58) {
                  ffpmsg((char *)0x1244ae);
                  *in_stack_00000008 = 0x105;
                  return 0x105;
                }
              }
              else {
                iVar2 = iVar6 + 1;
                local_50b8[iVar5] = (long)(&stack0xfffffffffffe7288 + (long)iVar6 * 0x51);
                iVar6 = iVar6 + 2;
                local_3178[iVar5] = (long)(&stack0xfffffffffffe7288 + (long)iVar2 * 0x51);
                strcpy((char *)local_50b8[iVar5],local_1b8);
                strcpy((char *)local_3178[iVar5],local_168);
              }
              iVar3 = iVar3 + 1;
              iVar4 = iVar4 + 1;
            }
            if (local_28 != 0) {
              iVar6 = fficls(in_stack_fffffffffffe7458,in_stack_fffffffffffe7454,
                             in_stack_fffffffffffe7450,in_stack_fffffffffffe7448,
                             in_stack_fffffffffffe7440,in_stack_fffffffffffe7438);
              if (0 < iVar6) {
                ffpmsg((char *)0x124548);
                return *in_stack_00000008;
              }
              for (iVar6 = 0; iVar6 < local_24; iVar6 = iVar6 + 1) {
                ffkeyn((char *)in_stack_fffffffffffe72a8,in_stack_fffffffffffe72a4,
                       (char *)in_stack_fffffffffffe7298,
                       (int *)CONCAT44(in_stack_fffffffffffe7294,in_stack_fffffffffffe7290));
                ffgkys(in_stack_fffffffffffe72c8,in_stack_fffffffffffe72c0,
                       (char *)in_stack_fffffffffffe72b8,in_stack_fffffffffffe72b0,
                       in_stack_fffffffffffe72a8);
                ffkeyn((char *)in_stack_fffffffffffe72a8,in_stack_fffffffffffe72a4,
                       (char *)in_stack_fffffffffffe7298,
                       (int *)CONCAT44(in_stack_fffffffffffe7294,in_stack_fffffffffffe7290));
                ffmcom(in_stack_fffffffffffe7378,(char *)in_stack_fffffffffffe7370,
                       in_stack_fffffffffffe7368,in_stack_fffffffffffe7360);
                ffkeyn((char *)in_stack_fffffffffffe72a8,in_stack_fffffffffffe72a4,
                       (char *)in_stack_fffffffffffe7298,
                       (int *)CONCAT44(in_stack_fffffffffffe7294,in_stack_fffffffffffe7290));
                ffgkys(in_stack_fffffffffffe72c8,in_stack_fffffffffffe72c0,
                       (char *)in_stack_fffffffffffe72b8,in_stack_fffffffffffe72b0,
                       in_stack_fffffffffffe72a8);
                ffkeyn((char *)in_stack_fffffffffffe72a8,in_stack_fffffffffffe72a4,
                       (char *)in_stack_fffffffffffe7298,
                       (int *)CONCAT44(in_stack_fffffffffffe7294,in_stack_fffffffffffe7290));
                ffmcom(in_stack_fffffffffffe7378,(char *)in_stack_fffffffffffe7370,
                       in_stack_fffffffffffe7368,in_stack_fffffffffffe7360);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
                ffcpky(in_stack_fffffffffffe73d0,in_stack_fffffffffffe73c8,in_stack_fffffffffffe73c4
                       ,in_stack_fffffffffffe73c0,in_stack_fffffffffffe73b8,
                       in_stack_fffffffffffe73b0);
              }
              iVar6 = ffrdef(in_stack_fffffffffffe7378,in_stack_fffffffffffe7370);
              if (iVar6 != 0) {
                return *in_stack_00000008;
              }
            }
            for (iVar6 = 0; iVar6 < local_24; iVar6 = iVar6 + 1) {
              ffcpcl(in_stack_fffffffffffe7558,in_stack_fffffffffffe7550,in_stack_fffffffffffe754c,
                     in_stack_fffffffffffe7548,in_stack_fffffffffffe7544,in_stack_fffffffffffe7538);
            }
            local_4 = *in_stack_00000008;
          }
          else {
            ffpmsg((char *)0x1241f7);
            *in_stack_00000008 = 0xe6;
            local_4 = 0xe6;
          }
        }
      }
      else {
        local_4 = *in_stack_00000008;
      }
    }
    else {
      *in_stack_00000008 = 0x6f;
      local_4 = 0x6f;
    }
  }
  else {
    local_4 = *in_stack_00000008;
  }
  return local_4;
}

Assistant:

int ffccls(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int incol,           /* I - number of first input column   */
           int outcol,          /* I - number for first output column  */
	   int ncols,           /* I - number of columns to copy from input to output */
           int create_col,      /* I - create new col if TRUE, else overwrite */
           int *status)         /* IO - error status     */
/*
  copy multiple columns from infptr and insert them in the outfptr
  table.  Optimized for multiple-column case since it only expands the
  output file once using fits_insert_cols() instead of calling
  fits_insert_col() multiple times.
*/
{
    int tstatus, colnum, typecode, otypecode, anynull;
    int inHduType, outHduType;
    long tfields, repeat, orepeat, width, owidth, nrows, outrows;
    long inloop, outloop, maxloop, ndone, ntodo, npixels;
    long firstrow, firstelem, ii;
    char keyname[FLEN_KEYWORD], ttype[FLEN_VALUE], tform[FLEN_VALUE];
    char ttype_comm[FLEN_COMMENT],tform_comm[FLEN_COMMENT];
    char *lvalues = 0, nullflag, **strarray = 0;
    char nulstr[] = {'\5', '\0'};  /* unique null string value */
    double dnull = 0.l, *dvalues = 0;
    float fnull = 0., *fvalues = 0;
    int typecodes[1000];
    char *ttypes[1000], *tforms[1000], keyarr[1001][FLEN_CARD];
    int ikey = 0;
    int icol, incol1, outcol1;

    if (*status > 0)
        return(*status);

    /* Do not allow more than internal array limit to be copied */
    if (ncols > 1000) return (*status = ARRAY_TOO_BIG);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */
    inHduType = (infptr->Fptr)->hdutype;
    
    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */
    outHduType = (outfptr->Fptr)->hdutype;
    
    if (*status > 0)
        return(*status);

    if (inHduType == IMAGE_HDU || outHduType == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy columns to or from IMAGE HDUs (ffccls)");
       return(*status = NOT_TABLE);
    }

    if ( (inHduType == BINARY_TBL &&  outHduType == ASCII_TBL) ||
	 (inHduType == ASCII_TBL  &&  outHduType == BINARY_TBL) )
    {
       ffpmsg
       ("Copying between Binary and ASCII tables is not supported (ffccls)");
       return(*status = NOT_BTABLE);
    }

    /* Do not allow copying multiple columns in the same HDU because the
       permutations of possible overlapping copies is mind-bending */
    if ((infptr->Fptr == outfptr->Fptr)
	&& (infptr->HDUposition == outfptr->HDUposition))
    {
       ffpmsg
       ("Copying multiple columns in same HDU is not supported (ffccls)");
       return(*status = NOT_BTABLE);
    }

    /* Retrieve the number of columns in output file */
    tstatus=0;
    if (ffgkyj(outfptr, "TFIELDS", &tfields, 0, &tstatus))
    {
      ffpmsg
	("Could not read TFIELDS keyword in output table (ffccls)");
      return(*status = NO_TFIELDS);
    }

    colnum = minvalue((int) tfields + 1, outcol); /* output col. number */

    /* Collect data about input column (type, repeat, etc) */
    for (incol1 = incol, outcol1 = colnum, icol = 0; 
	 icol < ncols; 
	 icol++, incol1++, outcol1++)
    {
      ffgtcl(infptr, incol1, &typecode, &repeat, &width, status);

      if (typecode < 0)
	{
	  ffpmsg("Variable-length columns are not supported (ffccls)");
	  return(*status = BAD_TFORM);
	}

      typecodes[icol] = typecode;

      tstatus = 0;
      ffkeyn("TTYPE", incol1, keyname, &tstatus);
      ffgkys(infptr, keyname, ttype, ttype_comm, &tstatus);

      ffkeyn("TFORM", incol1, keyname, &tstatus);
    
      if (ffgkys(infptr, keyname, tform, tform_comm, &tstatus) )
        {
          ffpmsg
	    ("Could not find TTYPE and TFORM keywords in input table (ffccls)");
          return(*status = NO_TFORM);
        }

      /* If creating columns, we need to save these values */
      if ( create_col ) {
	tforms[icol] = keyarr[ikey++];
	ttypes[icol] = keyarr[ikey++];

	strcpy(tforms[icol], tform);
	strcpy(ttypes[icol], ttype);
      } else {
	/* If not creating columns, then check the datatype and vector
	   repeat length of the output column */
        ffgtcl(outfptr, outcol1, &otypecode, &orepeat, &owidth, status);

        if (orepeat != repeat) {
            ffpmsg("Input and output vector columns must have same length (ffccls)");
            return(*status = BAD_TFORM);
        }
      }
    }

    /* Insert columns into output file and copy all meta-data
       keywords, if requested */
    if (create_col)
    {
        /* create the empty columns */
        if (fficls(outfptr, colnum, ncols, ttypes, tforms, status) > 0)
        {
           ffpmsg
           ("Could not append new columns to output file (ffccls)");
           return(*status);
        }

	/* Copy meta-data strings from input column to output */
	for (incol1 = incol, outcol1 = colnum, icol = 0; 
	     icol < ncols; 
	     icol++, incol1++, outcol1++)
	{
	  /* copy the comment strings from the input file for TTYPE and TFORM */
	  ffkeyn("TTYPE", incol1, keyname, status);
	  ffgkys(infptr, keyname, ttype, ttype_comm, status);
	  ffkeyn("TTYPE", outcol1, keyname, status);
	  ffmcom(outfptr, keyname, ttype_comm, status);
	  
	  ffkeyn("TFORM", incol1, keyname, status);
	  ffgkys(infptr, keyname, tform, tform_comm, status);
	  ffkeyn("TFORM", outcol1, keyname, status);
	  ffmcom(outfptr, keyname, tform_comm, status);
	  
	  /* copy other column-related keywords if they exist */
	  
	  ffcpky(infptr, outfptr, incol1, outcol1, "TUNIT", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TSCAL", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TZERO", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TDISP", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TLMIN", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TLMAX", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TDIM", status);

	  /*  WCS keywords */
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCTYP", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCUNI", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCRVL", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCRPX", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCDLT", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCROT", status);
	  
	  ffcpky(infptr, outfptr, incol1, outcol1, "TNULL", status);

	}

	/* rescan header to recognize the new keywords */
	if (ffrdef(outfptr, status) )
	  return(*status);
    }
	
    /* Copy columns using standard ffcpcl(); do this in a loop because
       the I/O-intensive column expanding is done */
    for (incol1 = incol, outcol1 = colnum, icol = 0; 
	 icol < ncols; 
	 icol++, incol1++, outcol1++)
    {
      ffcpcl(infptr, outfptr, incol1, outcol1, 0, status);
    }

    return(*status);
}